

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O1

int lws_interface_to_sa(int ipv6,char *ifname,sockaddr_in *addr,size_t addrlen)

{
  short *psVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint *puVar7;
  long *plVar8;
  bool bVar9;
  ifaddrs *ifr;
  long *local_38;
  
  iVar4 = getifaddrs(&local_38);
  if (iVar4 == 0) {
    if (local_38 == (long *)0x0) {
      bVar9 = true;
      iVar4 = -1;
    }
    else {
      iVar4 = -1;
      plVar8 = local_38;
      do {
        if (((ushort *)plVar8[3] != (ushort *)0x0) && (plVar8[1] != 0)) {
          _lws_log(0x10," interface %s vs %s (fam %d) ipv6 %d\n",plVar8[1],ifname,
                   (ulong)*(ushort *)plVar8[3],ipv6);
          iVar5 = strcmp((char *)plVar8[1],ifname);
          if (iVar5 == 0) {
            psVar1 = (short *)plVar8[3];
            if (*psVar1 == 2) {
              uVar2 = *(undefined8 *)psVar1;
              uVar3 = *(undefined8 *)(psVar1 + 4);
              addr->sin_family = (short)uVar2;
              addr->sin_port = (short)((ulong)uVar2 >> 0x10);
              addr->sin_addr = (in_addr)(int)((ulong)uVar2 >> 0x20);
              *(undefined8 *)addr->sin_zero = uVar3;
              iVar4 = 0;
            }
            else if (*psVar1 == 0x11) {
              iVar4 = -2;
            }
          }
        }
        plVar8 = (long *)*plVar8;
        bVar9 = iVar4 != 0;
      } while ((plVar8 != (long *)0x0) && (iVar4 != 0));
    }
    freeifaddrs(local_38);
    iVar5 = 0;
    if ((bVar9) &&
       (iVar6 = lws_sa46_parse_numeric_address(ifname,(lws_sockaddr46 *)addr), iVar5 = iVar4,
       iVar6 == 0)) {
      iVar5 = 0;
    }
  }
  else {
    puVar7 = (uint *)__errno_location();
    _lws_log(1,"%s: unable to getifaddrs: errno %d\n","lws_interface_to_sa",(ulong)*puVar7);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int
lws_interface_to_sa(int ipv6, const char *ifname, struct sockaddr_in *addr,
		    size_t addrlen)
{
	int rc = LWS_ITOSA_NOT_EXIST;

	struct ifaddrs *ifr;
	struct ifaddrs *ifc;
#ifdef LWS_WITH_IPV6
	struct sockaddr_in6 *addr6 = (struct sockaddr_in6 *)addr;
#endif

	if (getifaddrs(&ifr)) {
		lwsl_err("%s: unable to getifaddrs: errno %d\n", __func__, errno);

		return LWS_ITOSA_USABLE;
	}
	for (ifc = ifr; ifc != NULL && rc; ifc = ifc->ifa_next) {
		if (!ifc->ifa_addr || !ifc->ifa_name)
			continue;

		lwsl_debug(" interface %s vs %s (fam %d) ipv6 %d\n",
			   ifc->ifa_name, ifname,
			   ifc->ifa_addr->sa_family, ipv6);

		if (strcmp(ifc->ifa_name, ifname))
			continue;

		switch (ifc->ifa_addr->sa_family) {
#if defined(AF_PACKET)
		case AF_PACKET:
			/* interface exists but is not usable */
			rc = LWS_ITOSA_NOT_USABLE;
			continue;
#endif

		case AF_INET:
#ifdef LWS_WITH_IPV6
			if (ipv6) {
				/* map IPv4 to IPv6 */
				memset((char *)&addr6->sin6_addr, 0,
						sizeof(struct in6_addr));
				addr6->sin6_addr.s6_addr[10] = 0xff;
				addr6->sin6_addr.s6_addr[11] = 0xff;
				memcpy(&addr6->sin6_addr.s6_addr[12],
				       &((struct sockaddr_in *)ifc->ifa_addr)->sin_addr,
							sizeof(struct in_addr));
				lwsl_debug("%s: uplevelling ipv4 bind to ipv6\n", __func__);
			} else
#endif
				memcpy(addr,
					(struct sockaddr_in *)ifc->ifa_addr,
						    sizeof(struct sockaddr_in));
			break;
#ifdef LWS_WITH_IPV6
		case AF_INET6:
			memcpy(&addr6->sin6_addr,
			  &((struct sockaddr_in6 *)ifc->ifa_addr)->sin6_addr,
						       sizeof(struct in6_addr));
			break;
#endif
		default:
			continue;
		}
		rc = LWS_ITOSA_USABLE;
	}

	freeifaddrs(ifr);

	if (rc &&
	    !lws_sa46_parse_numeric_address(ifname, (lws_sockaddr46 *)addr))
		rc = LWS_ITOSA_USABLE;

	return rc;
}